

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

long __thiscall internalJSONNode::operator_cast_to_long(internalJSONNode *this)

{
  json_string *pjVar1;
  json_string *pjVar2;
  byte bVar3;
  ulong uVar4;
  allocator local_61;
  json_number local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Fetch(this);
  bVar3 = this->_type;
  uVar4 = (ulong)bVar3;
  if (bVar3 != 0) {
    if (bVar3 == 1) {
      FetchNumber(this);
      bVar3 = this->_type;
    }
    else if (bVar3 == 3) {
      return (ulong)(this->_value)._bool;
    }
    pjVar1 = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&local_38,pjVar1,"(long)");
    JSONDebug::_JSON_ASSERT(bVar3 == 2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    local_60 = (this->_value)._number;
    pjVar1 = &this->_string;
    pjVar2 = jsonSingletonERROR_LOWER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_58,pjVar1,pjVar2);
    std::operator+(&local_38,&local_58,"long");
    JSONDebug::_JSON_ASSERT(-9.223372036854776e+18 < local_60,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    local_60 = (this->_value)._number;
    pjVar2 = jsonSingletonERROR_UPPER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_58,pjVar1,pjVar2);
    std::operator+(&local_38,&local_58,"long");
    JSONDebug::_JSON_ASSERT(local_60 < 9.223372036854776e+18,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    local_60 = (this->_value)._number;
    std::__cxx11::string::string((string *)&local_58,"(long) will truncate ",&local_61);
    std::operator+(&local_38,&local_58,pjVar1);
    JSONDebug::_JSON_ASSERT((bool)(-((double)(long)local_60 == local_60) & 1),&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar4 = (ulong)(this->_value)._number;
  }
  return uVar4;
}

Assistant:

internalJSONNode::operator long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long)"));
		  JSON_ASSERT(_value._number > LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number < LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number == (json_number)((long)_value._number), json_string(JSON_TEXT("(long) will truncate ")) + _string);
		  return (long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long long)"));
		  #ifdef LONG_LONG_MAX			 
			 JSON_ASSERT(_value._number < LONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number < LLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #endif
		  #ifdef LONG_LONG_MIN
			 JSON_ASSERT(_value._number > LONG_LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number > LLONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #endif

		  JSON_ASSERT(_value._number == (json_number)((long long)_value._number), json_string(JSON_TEXT("(long long) will truncate ")) + _string);
		  return (long long)_value._number;
	   #endif /*<- */
    }